

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gf256.cpp
# Opt level: O2

int gf256_init_(int version)

{
  uint8_t uVar1;
  ushort uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  uint i;
  undefined8 in_RAX;
  long lVar7;
  uint8_t *puVar8;
  byte bVar9;
  byte bVar10;
  int x;
  long lVar11;
  ulong uVar12;
  int iVar13;
  byte bVar14;
  long lVar15;
  uint8_t *puVar16;
  uchar x_1;
  long lVar17;
  ulong uVar18;
  ulong uVar19;
  long lVar20;
  bool bVar21;
  int local_34;
  
  if (version == 2) {
    iVar13 = 0;
    if (Initialized == '\0') {
      Initialized = '\x01';
      for (lVar7 = 0; lVar7 != 4; lVar7 = lVar7 + 1) {
        *(uchar *)((long)&local_34 + lVar7) = "\x04\x03\x02\x01"[lVar7];
      }
      local_34 = (int)((ulong)in_RAX >> 0x20);
      if (local_34 == 0x1020304) {
        lVar7 = cpuid_Version_info(1);
        lVar15 = 0;
        CpuHasSSSE3 = (bool)((byte)(*(uint *)(lVar7 + 0xc) >> 9) & 1);
        lVar7 = cpuid_Extended_Feature_Enumeration_info(7);
        bVar14 = (byte)*(undefined4 *)(lVar7 + 4) >> 5;
        bVar9 = 1;
        GF256Ctx.Polynomial = 0x14d;
        GF256Ctx.GF256_LOG_TABLE[0] = 0x200;
        GF256Ctx.GF256_EXP_TABLE[0] = '\x01';
        CpuHasAVX2 = (bool)(bVar14 & 1);
        while (lVar15 != 0xfe) {
          bVar10 = 0;
          if ((char)bVar9 < '\0') {
            bVar10 = 0x4d;
          }
          bVar9 = bVar10 ^ bVar9 * '\x02';
          GF256Ctx.GF256_EXP_TABLE[lVar15 + 1] = bVar9;
          lVar15 = lVar15 + 1;
          GF256Ctx.GF256_LOG_TABLE[bVar9] = (uint16_t)lVar15;
        }
        GF256Ctx.GF256_EXP_TABLE[0xff] = '\x01';
        GF256Ctx.GF256_LOG_TABLE[1] = 0xff;
        for (lVar7 = -0xfe; lVar7 != 0; lVar7 = lVar7 + 1) {
          GF256Ctx.GF256_EXP_TABLE[lVar7 + 0x1fe] = GF256Ctx.GF256_EXP_TABLE[lVar7 + 0xff];
        }
        GF256Ctx.GF256_EXP_TABLE[0x1fe] = '\x01';
        for (lVar7 = 0; lVar7 != 0x1fd; lVar7 = lVar7 + 1) {
          GF256Ctx.GF256_EXP_TABLE[lVar7 + 0x1ff] = '\0';
        }
        for (lVar7 = 0; lVar7 != 0x100; lVar7 = lVar7 + 1) {
          GF256Ctx.GF256_DIV_TABLE[lVar7] = '\0';
          GF256Ctx.GF256_MUL_TABLE[lVar7] = '\0';
        }
        lVar15 = 0x111620;
        lVar11 = 0x121620;
        lVar17 = 0x121721;
        for (lVar7 = 1; lVar7 != 0x100; lVar7 = lVar7 + 1) {
          bVar9 = (byte)GF256Ctx.GF256_LOG_TABLE[lVar7];
          *(undefined1 *)(lVar15 + 0x100) = 0;
          *(undefined1 *)(lVar11 + 0x100) = 0;
          lVar15 = lVar15 + 0x100;
          lVar11 = lVar11 + 0x100;
          for (lVar20 = 0; lVar20 != 0xff; lVar20 = lVar20 + 1) {
            uVar2 = GF256Ctx.GF256_LOG_TABLE[lVar20 + 1];
            *(uint8_t *)(lVar17 + -0x10000 + lVar20) =
                 GF256Ctx.GF256_EXP_TABLE[(ulong)uVar2 + (ulong)bVar9];
            *(uint8_t *)(lVar17 + lVar20) =
                 GF256Ctx.GF256_EXP_TABLE[(ulong)uVar2 + (ulong)(bVar9 ^ 0xff)];
          }
          lVar17 = lVar17 + 0x100;
        }
        puVar8 = GF256Ctx.GF256_INV_TABLE;
        for (lVar7 = -0x10000; lVar7 != 0; lVar7 = lVar7 + 0x100) {
          *puVar8 = GF256Ctx.GF256_INV_TABLE[lVar7 + 1];
          puVar8 = puVar8 + 1;
        }
        puVar8 = GF256Ctx.GF256_SQR_TABLE;
        for (lVar7 = -0x10100; lVar7 != 0; lVar7 = lVar7 + 0x101) {
          *puVar8 = GF256Ctx.GF256_DIV_TABLE[lVar7 + 0x100];
          puVar8 = puVar8 + 1;
        }
        puVar8 = GF256Ctx.GF256_MUL_TABLE;
        for (lVar7 = 0; lVar7 != 0x100; lVar7 = lVar7 + 1) {
          puVar16 = puVar8;
          for (lVar15 = 0; uVar6 = m_SelfTestBuffers.B._8_8_, uVar5 = m_SelfTestBuffers.B._0_8_,
              uVar4 = m_SelfTestBuffers.A._8_8_, uVar3 = m_SelfTestBuffers.A._0_8_, lVar15 != 0x10;
              lVar15 = lVar15 + 1) {
            uVar1 = *puVar16;
            puVar16 = puVar16 + 0x10;
            m_SelfTestBuffers.A[lVar15] = puVar8[lVar15];
            m_SelfTestBuffers.B[lVar15] = uVar1;
          }
          GF256Ctx.MM128.TABLE_LO_Y[lVar7][0] = m_SelfTestBuffers.A._0_8_;
          GF256Ctx.MM128.TABLE_LO_Y[lVar7][1] = uVar4;
          GF256Ctx.MM128.TABLE_HI_Y[lVar7][0] = uVar5;
          GF256Ctx.MM128.TABLE_HI_Y[lVar7][1] = uVar6;
          if ((bVar14 & 1) != 0) {
            GF256Ctx.MM256.TABLE_LO_Y[lVar7][2] = uVar3;
            GF256Ctx.MM256.TABLE_LO_Y[lVar7][3] = uVar4;
            GF256Ctx.MM256.TABLE_LO_Y[lVar7][0] = uVar3;
            GF256Ctx.MM256.TABLE_LO_Y[lVar7][1] = uVar4;
            GF256Ctx.MM256.TABLE_HI_Y[lVar7][0] = uVar5;
            GF256Ctx.MM256.TABLE_HI_Y[lVar7][1] = uVar6;
            GF256Ctx.MM256.TABLE_HI_Y[lVar7][2] = uVar5;
            GF256Ctx.MM256.TABLE_HI_Y[lVar7][3] = uVar6;
          }
          puVar8 = puVar8 + 0x100;
        }
        lVar7 = 0x111620;
        iVar13 = -3;
        for (uVar12 = 0; uVar12 != 0x100; uVar12 = uVar12 + 1) {
          uVar18 = 0;
          lVar15 = 0;
          while (lVar15 != 0x10000) {
            uVar19 = (ulong)*(byte *)(lVar7 + lVar15);
            if (lVar15 == 0 || uVar12 == 0) {
              if (uVar19 != 0) {
                return -3;
              }
              uVar19 = 0;
            }
            else {
              if (uVar18 != GF256Ctx.GF256_DIV_TABLE[uVar12 << 8 | uVar19]) {
                return -3;
              }
              if (uVar12 != *(byte *)(lVar15 + uVar19 + 0x121620)) {
                return -3;
              }
            }
            uVar18 = uVar18 + 1;
            lVar11 = lVar15 + 0x100;
            bVar21 = lVar15 == 0x100;
            lVar15 = lVar11;
            if ((bVar21) && (uVar12 != uVar19)) {
              return -3;
            }
          }
          lVar7 = lVar7 + 1;
        }
        m_SelfTestBuffers.A[0x3f] = 'Z';
        m_SelfTestBuffers.B[0x3f] = 'Z';
        m_SelfTestBuffers.C[0x3f] = 'Z';
        for (lVar7 = -0x3f; lVar7 != 0; lVar7 = lVar7 + 1) {
          m_SelfTestBuffers.A[lVar7 + 0x3f] = '\x1f';
          m_SelfTestBuffers.B[lVar7 + 0x3f] = 0xf7;
        }
        gf256_add_mem(&m_SelfTestBuffers,m_SelfTestBuffers.B,0x3f);
        lVar7 = 0;
        while (lVar7 != 0x3f) {
          puVar8 = m_SelfTestBuffers.A + lVar7;
          lVar7 = lVar7 + 1;
          if (*puVar8 != 0xe8) {
            return -3;
          }
        }
        for (lVar7 = -0x3f; lVar7 != 0; lVar7 = lVar7 + 1) {
          m_SelfTestBuffers.A[lVar7 + 0x3f] = '\x1f';
          m_SelfTestBuffers.B[lVar7 + 0x3f] = 0xf7;
          m_SelfTestBuffers.C[lVar7 + 0x3f] = 'q';
        }
        gf256_add2_mem(&m_SelfTestBuffers,m_SelfTestBuffers.B,m_SelfTestBuffers.C,0x3f);
        lVar7 = 0;
        while (lVar7 != 0x3f) {
          puVar8 = m_SelfTestBuffers.A + lVar7;
          lVar7 = lVar7 + 1;
          if (*puVar8 != 0x99) {
            return -3;
          }
        }
        for (lVar7 = -0x3f; lVar7 != 0; lVar7 = lVar7 + 1) {
          m_SelfTestBuffers.A[lVar7 + 0x3f] = 'U';
          m_SelfTestBuffers.B[lVar7 + 0x3f] = 0xaa;
          m_SelfTestBuffers.C[lVar7 + 0x3f] = 'l';
        }
        gf256_addset_mem(&m_SelfTestBuffers,m_SelfTestBuffers.B,m_SelfTestBuffers.C,0x3f);
        lVar7 = 0;
        do {
          if (lVar7 == 0x3f) {
            for (lVar7 = -0x3f; uVar1 = GF256Ctx.GF256_MUL_TABLE[0x6caa], lVar7 != 0;
                lVar7 = lVar7 + 1) {
              m_SelfTestBuffers.A[lVar7 + 0x3f] = 0xff;
              m_SelfTestBuffers.B[lVar7 + 0x3f] = 0xaa;
            }
            gf256_muladd_mem(&m_SelfTestBuffers,'l',m_SelfTestBuffers.B,0x3f);
            lVar7 = 0;
            while (lVar7 != 0x3f) {
              puVar8 = m_SelfTestBuffers.A + lVar7;
              lVar7 = lVar7 + 1;
              if ((*puVar8 ^ uVar1) != 0xff) {
                return -3;
              }
            }
            for (lVar7 = -0x3f; uVar1 = GF256Ctx.GF256_MUL_TABLE[0x55a2], lVar7 != 0;
                lVar7 = lVar7 + 1) {
              m_SelfTestBuffers.A[lVar7 + 0x3f] = 0xff;
              m_SelfTestBuffers.B[lVar7 + 0x3f] = 'U';
            }
            gf256_mul_mem(&m_SelfTestBuffers,m_SelfTestBuffers.B,0xa2,0x3f);
            lVar7 = 0;
            while (lVar7 != 0x3f) {
              puVar8 = m_SelfTestBuffers.A + lVar7;
              lVar7 = lVar7 + 1;
              if (*puVar8 != uVar1) {
                return -3;
              }
            }
            if (m_SelfTestBuffers.A[0x3f] != 'Z') {
              return -3;
            }
            if (m_SelfTestBuffers.B[0x3f] != 'Z') {
              return -3;
            }
            return (uint)(m_SelfTestBuffers.C[0x3f] == 'Z') * 3 + -3;
          }
          puVar8 = m_SelfTestBuffers.A + lVar7;
          lVar7 = lVar7 + 1;
        } while (*puVar8 == 0xc6);
      }
      else {
        iVar13 = -2;
      }
    }
  }
  else {
    iVar13 = -1;
  }
  return iVar13;
}

Assistant:

int gf256_init_(int version)
{
    if (version != GF256_VERSION)
        return -1; // User's header does not match library version.

    // Avoid multiple initialization
    if (Initialized)
        return 0;
    Initialized = true;

    if (!IsExpectedEndian())
        return -2; // Unexpected byte order.

    gf256_architecture_init();
    gf256_poly_init(kDefaultPolynomialIndex);
    gf256_explog_init();
    gf256_muldiv_init();
    gf256_inv_init();
    gf256_sqr_init();
    gf256_mul_mem_init();

    if (!gf256_self_test())
        return -3; // Self-test failed (perhaps untested configuration)

    return 0;
}